

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

int __thiscall Catch::StringRef::compare(StringRef *this,StringRef rhs)

{
  char *__s1;
  unsigned_long *puVar1;
  int cmpResult;
  StringRef *this_local;
  StringRef rhs_local;
  
  rhs_local.m_start = (char *)rhs.m_size;
  __s1 = this->m_start;
  puVar1 = std::min<unsigned_long>(&this->m_size,(unsigned_long *)&rhs_local);
  rhs_local.m_size._4_4_ = strncmp(__s1,rhs.m_start,*puVar1);
  if (rhs_local.m_size._4_4_ == 0) {
    if ((char *)this->m_size < rhs_local.m_start) {
      rhs_local.m_size._4_4_ = -1;
    }
    else if (rhs_local.m_start < (char *)this->m_size) {
      rhs_local.m_size._4_4_ = 1;
    }
    else {
      rhs_local.m_size._4_4_ = 0;
    }
  }
  return rhs_local.m_size._4_4_;
}

Assistant:

int StringRef::compare( StringRef rhs ) const {
        auto cmpResult =
            strncmp( m_start, rhs.m_start, std::min( m_size, rhs.m_size ) );

        // This means that strncmp found a difference before the strings
        // ended, and we can return it directly
        if ( cmpResult != 0 ) {
            return cmpResult;
        }

        // If strings are equal up to length, then their comparison results on
        // their size
        if ( m_size < rhs.m_size ) {
            return -1;
        } else if ( m_size > rhs.m_size ) {
            return 1;
        } else {
            return 0;
        }
    }